

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string_t duckdb::Base64DecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  Vector *vector;
  idx_t len;
  char *pcVar1;
  idx_t in_R8;
  string_t str;
  string_t str_00;
  string_t result_blob;
  anon_union_16_2_67f50693_for_value local_30;
  
  str.value._0_8_ = input.value._8_8_;
  str.value.pointer.ptr = (char *)result;
  vector = (Vector *)Blob::FromBase64Size(input.value._0_8_,str);
  local_30.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)result,vector,len);
  pcVar1 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    pcVar1 = local_30.pointer.prefix;
  }
  str_00.value.pointer.ptr = pcVar1;
  str_00.value._0_8_ = str.value._0_8_;
  Blob::FromBase64(input.value._0_8_,str_00,(data_ptr_t)vector,in_R8);
  string_t::Finalize((string_t *)&local_30.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_size = Blob::FromBase64Size(input);
		auto result_blob = StringVector::EmptyString(result, result_size);
		Blob::FromBase64(input, data_ptr_cast(result_blob.GetDataWriteable()), result_size);
		result_blob.Finalize();
		return result_blob;
	}